

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O2

void Cmd_menu_quit(FCommandLine *argv,APlayerPawn *who,int key)

{
  DMenu *menu;
  
  M_StartControlPanel(true);
  menu = (DMenu *)DObject::operator_new(0x50);
  DQuitMenu::DQuitMenu((DQuitMenu *)menu,false);
  (menu->mParentMenu).field_0.p = DMenu::CurrentMenu;
  M_ActivateMenu(menu);
  return;
}

Assistant:

CCMD (menu_quit)
{	// F10
	M_StartControlPanel (true);
	DMenu *newmenu = new DQuitMenu(false);
	newmenu->mParentMenu = DMenu::CurrentMenu;
	M_ActivateMenu(newmenu);
}